

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int syncJournal(Pager *pPager,int newHdr)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  i64 offset;
  uchar local_44 [8];
  u8 zHeader [12];
  u8 aMagic [8];
  i64 iNextHdrOffset;
  int local_20;
  int iDc;
  int rc;
  int newHdr_local;
  Pager *pPager_local;
  
  iVar1 = sqlite3PagerExclusiveLock(pPager);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (pPager->noSync == '\0') {
    if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) || (pPager->journalMode == '\x04')) {
      pPager->journalHdr = pPager->journalOff;
    }
    else {
      uVar2 = sqlite3OsDeviceCharacteristics(pPager->fd);
      if ((uVar2 & 0x200) == 0) {
        local_44[0] = 0xd9;
        local_44[1] = 0xd5;
        local_44[2] = '\x05';
        local_44[3] = 0xf9;
        local_44[4] = ' ';
        local_44[5] = 0xa1;
        local_44[6] = 'c';
        local_44[7] = 0xd7;
        sqlite3Put4byte(zHeader,pPager->nRec);
        offset = journalHdrOffset(pPager);
        local_20 = sqlite3OsRead(pPager->jfd,zHeader + 4,8,offset);
        if ((local_20 == 0) && (iVar1 = memcmp(zHeader + 4,aJournalMagic,8), iVar1 == 0)) {
          local_20 = sqlite3OsWrite(pPager->jfd,"",1,offset);
        }
        if ((local_20 != 0) && (local_20 != 0x20a)) {
          return local_20;
        }
        if (((pPager->fullSync != '\0') && ((uVar2 & 0x400) == 0)) &&
           (iVar1 = sqlite3OsSync(pPager->jfd,(uint)pPager->syncFlags), iVar1 != 0)) {
          return iVar1;
        }
        iVar1 = sqlite3OsWrite(pPager->jfd,local_44,0xc,pPager->journalHdr);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      if ((uVar2 & 0x400) == 0) {
        uVar3 = 0;
        if (pPager->syncFlags == '\x03') {
          uVar3 = 0x10;
        }
        iVar1 = sqlite3OsSync(pPager->jfd,pPager->syncFlags | uVar3);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      pPager->journalHdr = pPager->journalOff;
      if ((newHdr != 0) && ((uVar2 & 0x200) == 0)) {
        pPager->nRec = 0;
        iVar1 = writeJournalHdr(pPager);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
    }
  }
  sqlite3PcacheClearSyncFlags(pPager->pPCache);
  pPager->eState = '\x04';
  return 0;
}

Assistant:

static int syncJournal(Pager *pPager, int newHdr){
  int rc;                         /* Return code */

  assert( pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( !pagerUseWal(pPager) );

  rc = sqlite3PagerExclusiveLock(pPager);
  if( rc!=SQLITE_OK ) return rc;

  if( !pPager->noSync ){
    assert( !pPager->tempFile );
    if( isOpen(pPager->jfd) && pPager->journalMode!=PAGER_JOURNALMODE_MEMORY ){
      const int iDc = sqlite3OsDeviceCharacteristics(pPager->fd);
      assert( isOpen(pPager->jfd) );

      if( 0==(iDc&SQLITE_IOCAP_SAFE_APPEND) ){
        /* This block deals with an obscure problem. If the last connection
        ** that wrote to this database was operating in persistent-journal
        ** mode, then the journal file may at this point actually be larger
        ** than Pager.journalOff bytes. If the next thing in the journal
        ** file happens to be a journal-header (written as part of the
        ** previous connection's transaction), and a crash or power-failure
        ** occurs after nRec is updated but before this connection writes
        ** anything else to the journal file (or commits/rolls back its
        ** transaction), then SQLite may become confused when doing the
        ** hot-journal rollback following recovery. It may roll back all
        ** of this connections data, then proceed to rolling back the old,
        ** out-of-date data that follows it. Database corruption.
        **
        ** To work around this, if the journal file does appear to contain
        ** a valid header following Pager.journalOff, then write a 0x00
        ** byte to the start of it to prevent it from being recognized.
        **
        ** Variable iNextHdrOffset is set to the offset at which this
        ** problematic header will occur, if it exists. aMagic is used
        ** as a temporary buffer to inspect the first couple of bytes of
        ** the potential journal header.
        */
        i64 iNextHdrOffset;
        u8 aMagic[8];
        u8 zHeader[sizeof(aJournalMagic)+4];

        memcpy(zHeader, aJournalMagic, sizeof(aJournalMagic));
        put32bits(&zHeader[sizeof(aJournalMagic)], pPager->nRec);

        iNextHdrOffset = journalHdrOffset(pPager);
        rc = sqlite3OsRead(pPager->jfd, aMagic, 8, iNextHdrOffset);
        if( rc==SQLITE_OK && 0==memcmp(aMagic, aJournalMagic, 8) ){
          static const u8 zerobyte = 0;
          rc = sqlite3OsWrite(pPager->jfd, &zerobyte, 1, iNextHdrOffset);
        }
        if( rc!=SQLITE_OK && rc!=SQLITE_IOERR_SHORT_READ ){
          return rc;
        }

        /* Write the nRec value into the journal file header. If in
        ** full-synchronous mode, sync the journal first. This ensures that
        ** all data has really hit the disk before nRec is updated to mark
        ** it as a candidate for rollback.
        **
        ** This is not required if the persistent media supports the
        ** SAFE_APPEND property. Because in this case it is not possible
        ** for garbage data to be appended to the file, the nRec field
        ** is populated with 0xFFFFFFFF when the journal header is written
        ** and never needs to be updated.
        */
        if( pPager->fullSync && 0==(iDc&SQLITE_IOCAP_SEQUENTIAL) ){
          PAGERTRACE(("SYNC journal of %d\n", PAGERID(pPager)));
          IOTRACE(("JSYNC %p\n", pPager))
          rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags);
          if( rc!=SQLITE_OK ) return rc;
        }
        IOTRACE(("JHDR %p %lld\n", pPager, pPager->journalHdr));
        rc = sqlite3OsWrite(
            pPager->jfd, zHeader, sizeof(zHeader), pPager->journalHdr
        );
        if( rc!=SQLITE_OK ) return rc;
      }
      if( 0==(iDc&SQLITE_IOCAP_SEQUENTIAL) ){
        PAGERTRACE(("SYNC journal of %d\n", PAGERID(pPager)));
        IOTRACE(("JSYNC %p\n", pPager))
        rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags|
          (pPager->syncFlags==SQLITE_SYNC_FULL?SQLITE_SYNC_DATAONLY:0)
        );
        if( rc!=SQLITE_OK ) return rc;
      }

      pPager->journalHdr = pPager->journalOff;
      if( newHdr && 0==(iDc&SQLITE_IOCAP_SAFE_APPEND) ){
        pPager->nRec = 0;
        rc = writeJournalHdr(pPager);
        if( rc!=SQLITE_OK ) return rc;
      }
    }else{
      pPager->journalHdr = pPager->journalOff;
    }
  }

  /* Unless the pager is in noSync mode, the journal file was just
  ** successfully synced. Either way, clear the PGHDR_NEED_SYNC flag on
  ** all pages.
  */
  sqlite3PcacheClearSyncFlags(pPager->pPCache);
  pPager->eState = PAGER_WRITER_DBMOD;
  assert( assert_pager_state(pPager) );
  return SQLITE_OK;
}